

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QRhiDriverInfo *info)

{
  char *pcVar1;
  QTextStream *pQVar2;
  Data *pDVar3;
  long in_RDX;
  undefined8 *puVar4;
  storage_type *psVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QDebugStateSaver saver;
  undefined1 *local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)info);
  pQVar2 = (QTextStream *)(info->deviceName).d.d;
  pQVar2[0x30] = (QTextStream)0x0;
  QVar6.m_data = (storage_type *)0x1a;
  QVar6.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<(pQVar2,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  puVar4 = *(undefined8 **)(in_RDX + 8);
  if (puVar4 == (undefined8 *)0x0) {
    puVar4 = &QByteArray::_empty;
  }
  QDebug::putByteArray((char *)info,(ulong)puVar4,(Latin1Content)*(undefined8 *)(in_RDX + 0x10));
  pQVar2 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  pQVar2 = (QTextStream *)(info->deviceName).d.d;
  QVar7.m_data = (storage_type *)0xc;
  QVar7.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar7);
  QTextStream::operator<<(pQVar2,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  Qt::hex((QTextStream *)(info->deviceName).d.d);
  QTextStream::operator<<((QTextStream *)(info->deviceName).d.d,*(ulonglong *)(in_RDX + 0x18));
  pQVar2 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  pQVar2 = (QTextStream *)(info->deviceName).d.d;
  QVar8.m_data = (storage_type *)0xc;
  QVar8.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<(pQVar2,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  QTextStream::operator<<((QTextStream *)(info->deviceName).d.d,*(ulonglong *)(in_RDX + 0x20));
  pQVar2 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  pQVar2 = (QTextStream *)(info->deviceName).d.d;
  QVar9.m_data = (storage_type *)0xc;
  QVar9.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar2,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  pQVar2 = (QTextStream *)(info->deviceName).d.d;
  psVar5 = (storage_type *)0xffffffffffffffff;
  do {
    pcVar1 = psVar5 + (long)((&PTR_anon_var_dwarf_4f828_007ec5f8)[*(int *)(in_RDX + 0x28)] + 1);
    psVar5 = psVar5 + 1;
  } while (*pcVar1 != '\0');
  QVar10.m_data = psVar5;
  QVar10.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar10);
  QTextStream::operator<<(pQVar2,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  QTextStream::operator<<((QTextStream *)(info->deviceName).d.d,')');
  pQVar2 = (QTextStream *)(info->deviceName).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  pDVar3 = (info->deviceName).d.d;
  (info->deviceName).d.d = (Data *)0x0;
  *(Data **)dbg.stream = pDVar3;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiDriverInfo &info)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QRhiDriverInfo(deviceName=" << info.deviceName
                  << " deviceId=0x" << Qt::hex << info.deviceId
                  << " vendorId=0x" << info.vendorId
                  << " deviceType=" << deviceTypeStr(info.deviceType)
                  << ')';
    return dbg;
}